

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void __thiscall diy::Bounds<float>::Bounds(Bounds<float> *this,int dim)

{
  DynamicPoint<float,_4UL>::DynamicPoint(&this->min,(long)dim,0.0);
  DynamicPoint<float,_4UL>::DynamicPoint(&this->max,(long)dim,0.0);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}